

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationgl_TessCoord::initTestDescriptor
          (TessellationShaderTessellationgl_TessCoord *this,_test_descriptor *test,
          _tessellation_shader_vertex_spacing vertex_spacing,
          _tessellation_primitive_mode primitive_mode,GLint n_patch_vertices,float *inner_tess_level
          ,float *outer_tess_level,_tessellation_test_type test_type)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  GLint GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *pTVar6;
  int local_c0 [2];
  GLint link_status;
  uint n_varyings;
  char *varyings [1];
  GLuint shader;
  uint n_shader;
  uint n_shaders;
  GLuint shaders [2];
  GLint compile_status;
  char *te_body_raw_ptr;
  string te_body;
  GLchar *local_60;
  char *tc_body_raw_ptr;
  string tc_body;
  Functions *gl;
  float *inner_tess_level_local;
  GLint n_patch_vertices_local;
  _tessellation_primitive_mode primitive_mode_local;
  _tessellation_shader_vertex_spacing vertex_spacing_local;
  _test_descriptor *test_local;
  TessellationShaderTessellationgl_TessCoord *this_local;
  
  test->n_patch_vertices = n_patch_vertices;
  test->primitive_mode = primitive_mode;
  test->type = test_type;
  test->vertex_spacing = vertex_spacing;
  *(undefined8 *)test->tess_level_inner = *(undefined8 *)inner_tess_level;
  *(undefined8 *)test->tess_level_outer = *(undefined8 *)outer_tess_level;
  *(undefined8 *)(test->tess_level_outer + 2) = *(undefined8 *)(outer_tess_level + 2);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  tc_body.field_2._8_8_ = CONCAT44(extraout_var,iVar1);
  GVar2 = (**(code **)(tc_body.field_2._8_8_ + 0x3c8))();
  test->po_id = GVar2;
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x75d);
  if (test_type == TESSELLATION_TEST_TYPE_FIRST) {
    GVar2 = (**(code **)(tc_body.field_2._8_8_ + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
    test->tc_id = GVar2;
  }
  GVar2 = (**(code **)(tc_body.field_2._8_8_ + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  test->te_id = GVar2;
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x767);
  if (test->tc_id != 0) {
    getTCCode_abi_cxx11_((string *)&tc_body_raw_ptr,this,n_patch_vertices);
    local_60 = (GLchar *)std::__cxx11::string::c_str();
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,test->tc_id,1,&local_60);
    dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
    glu::checkError(dVar3,"glShaderSource() failed for tessellation control shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x770);
    std::__cxx11::string::~string((string *)&tc_body_raw_ptr);
  }
  getTECode_abi_cxx11_((string *)&te_body_raw_ptr,this,vertex_spacing,primitive_mode);
  register0x00000000 = std::__cxx11::string::c_str();
  TestCaseBase::shaderSourceSpecialized
            (&this->super_TestCaseBase,test->te_id,1,(GLchar **)(shaders + 1));
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for tessellation evaluation shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x778);
  shaders[0] = 0;
  n_shader = test->tc_id;
  n_shaders = test->te_id;
  for (varyings[0]._4_4_ = 0; varyings[0]._4_4_ < 2; varyings[0]._4_4_ = varyings[0]._4_4_ + 1) {
    varyings[0]._0_4_ = (&n_shader)[varyings[0]._4_4_];
    if ((uint)varyings[0] != 0) {
      (**(code **)(tc_body.field_2._8_8_ + 0x248))((uint)varyings[0]);
      dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
      glu::checkError(dVar3,"glCompileShader() failed for tessellation shader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x786);
      (**(code **)(tc_body.field_2._8_8_ + 0xa70))((uint)varyings[0],0x8b81,shaders);
      dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv() failed for tessellation shader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x789);
      if (shaders[0] != 1) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Tessellation shader compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x78d);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
  }
  (**(code **)(tc_body.field_2._8_8_ + 0x10))(test->po_id,this->m_fs_id);
  (**(code **)(tc_body.field_2._8_8_ + 0x10))(test->po_id,test->te_id);
  (**(code **)(tc_body.field_2._8_8_ + 0x10))(test->po_id,this->m_vs_id);
  if (test->tc_id != 0) {
    (**(code **)(tc_body.field_2._8_8_ + 0x10))(test->po_id,test->tc_id);
  }
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glAttachShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x79c);
  _link_status = "result_uvw";
  local_c0[1] = 1;
  (**(code **)(tc_body.field_2._8_8_ + 0x14c8))(test->po_id,1,&link_status,0x8c8c);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glTransformFeedbackVaryings() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x7a3);
  local_c0[0] = 0;
  (**(code **)(tc_body.field_2._8_8_ + 0xce8))(test->po_id);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glLinkProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x7a9);
  (**(code **)(tc_body.field_2._8_8_ + 0x9d8))(test->po_id,0x8b82,local_c0);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glGetProgramiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x7ac);
  if (local_c0[0] == 1) {
    if (test->type == TESSELLATION_TEST_TYPE_FIRST) {
      GVar4 = (**(code **)(tc_body.field_2._8_8_ + 0xb48))(test->po_id,"inner_tess_level");
      test->inner_tess_level_uniform_location = GVar4;
      GVar4 = (**(code **)(tc_body.field_2._8_8_ + 0xb48))(test->po_id,"outer_tess_level");
      test->outer_tess_level_uniform_location = GVar4;
      (**(code **)(tc_body.field_2._8_8_ + 0x1680))(test->po_id);
      dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
      glu::checkError(dVar3,"glUseProgram() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x7be);
      (**(code **)(tc_body.field_2._8_8_ + 0x1528))
                (test->inner_tess_level_uniform_location,1,test->tess_level_inner);
      dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
      glu::checkError(dVar3,"glUniform2fv() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x7c2);
      (**(code **)(tc_body.field_2._8_8_ + 0x15a8))
                (test->outer_tess_level_uniform_location,1,test->tess_level_outer);
      dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
      glu::checkError(dVar3,"glUniform4fv() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x7c6);
    }
    std::__cxx11::string::~string((string *)&te_body_raw_ptr);
    return;
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"Program linking failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
             ,0x7b0);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TessellationShaderTessellationgl_TessCoord::initTestDescriptor(
	_test_descriptor& test, _tessellation_shader_vertex_spacing vertex_spacing,
	_tessellation_primitive_mode primitive_mode, glw::GLint n_patch_vertices, const float* inner_tess_level,
	const float* outer_tess_level, _tessellation_test_type test_type)
{
	test.n_patch_vertices = n_patch_vertices;
	test.primitive_mode   = primitive_mode;
	test.type			  = test_type;
	test.vertex_spacing   = vertex_spacing;

	memcpy(test.tess_level_inner, inner_tess_level, sizeof(float) * 2 /* components */);
	memcpy(test.tess_level_outer, outer_tess_level, sizeof(float) * 4 /* components */);

	/* Set up a program object for the descriptor */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	test.po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Set up a pass-specific tessellation shader objects. */
	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		test.tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	}

	test.te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed");

	/* Configure tessellation control shader body */
	if (test.tc_id != 0)
	{
		std::string tc_body			= getTCCode(n_patch_vertices);
		const char* tc_body_raw_ptr = tc_body.c_str();

		shaderSourceSpecialized(test.tc_id, 1 /* count */, &tc_body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation control shader");
	}

	/* Configure tessellation evaluation shader body */
	std::string te_body			= getTECode(vertex_spacing, primitive_mode);
	const char* te_body_raw_ptr = te_body.c_str();

	shaderSourceSpecialized(test.te_id, 1 /* count */, &te_body_raw_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation evaluation shader");

	/* Compile the tessellation evaluation shader */
	glw::GLint		   compile_status = GL_FALSE;
	glw::GLuint		   shaders[]	  = { test.tc_id, test.te_id };
	const unsigned int n_shaders	  = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLuint shader = shaders[n_shader];

		if (shader != 0)
		{
			gl.compileShader(shader);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed for tessellation shader");

			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed for tessellation shader");

			if (compile_status != GL_TRUE)
			{
				TCU_FAIL("Tessellation shader compilation failed");
			}
		}
	} /* for (all shaders) */

	/* Attach all shader to the program object */
	gl.attachShader(test.po_id, m_fs_id);
	gl.attachShader(test.po_id, test.te_id);
	gl.attachShader(test.po_id, m_vs_id);

	if (test.tc_id != 0)
	{
		gl.attachShader(test.po_id, test.tc_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() failed");

	/* Set up XFB */
	const char*		   varyings[] = { "result_uvw" };
	const unsigned int n_varyings = sizeof(varyings) / sizeof(varyings[0]);

	gl.transformFeedbackVaryings(test.po_id, n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed");

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(test.po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed");

	gl.getProgramiv(test.po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* If TCS stage is present, set up the corresponding uniforms as needed */
	if (test.type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		test.inner_tess_level_uniform_location = gl.getUniformLocation(test.po_id, "inner_tess_level");
		test.outer_tess_level_uniform_location = gl.getUniformLocation(test.po_id, "outer_tess_level");

		DE_ASSERT(test.inner_tess_level_uniform_location != -1);
		DE_ASSERT(test.outer_tess_level_uniform_location != -1);

		/* Now that we have the locations, let's configure the uniforms */
		gl.useProgram(test.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

		gl.uniform2fv(test.inner_tess_level_uniform_location, 1, /* count */
					  test.tess_level_inner);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform2fv() call failed");

		gl.uniform4fv(test.outer_tess_level_uniform_location, 1, /* count */
					  test.tess_level_outer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed");
	}
}